

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_diagnostic.c
# Opt level: O2

int IoTHubClient_Diagnostic_AddIfNecessary
              (IOTHUB_DIAGNOSTIC_SETTING_DATA *diagSetting,IOTHUB_MESSAGE_HANDLE messageHandle)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  IOTHUB_MESSAGE_RESULT IVar7;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *diagnosticData;
  char *__ptr;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *__s;
  time_t tVar8;
  LOGGER_LOG p_Var9;
  byte bVar10;
  byte bVar11;
  uint32_t uVar12;
  char *pcVar13;
  long lVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dStack_30;
  
  if (messageHandle == (IOTHUB_MESSAGE_HANDLE)0x0 ||
      diagSetting == (IOTHUB_DIAGNOSTIC_SETTING_DATA *)0x0) {
    return 0xa1;
  }
  uVar1 = diagSetting->diagSamplingPercentage;
  if (uVar1 == 0) {
    return 0;
  }
  uVar12 = diagSetting->currentMessageNumber;
  if (uVar12 == 0xffffffff) {
    uVar12 = (uint32_t)(0xffffffff % (ulong)(uVar1 * 100));
  }
  dVar17 = (double)(uVar12 + 1);
  diagSetting->currentMessageNumber = uVar12 + 1;
  auVar16._0_8_ = (double)uVar1 * (dVar17 + -2.0);
  auVar16._8_8_ = (double)uVar1 * (dVar17 + -1.0);
  auVar16 = divpd(auVar16,_DAT_001742d0);
  dVar17 = floor(auVar16._0_8_);
  dStack_30 = auVar16._8_8_;
  dVar15 = floor(dStack_30);
  if (dVar15 <= dVar17) {
    return 0;
  }
  diagnosticData = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)malloc(0x10);
  if (diagnosticData == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 == (LOGGER_LOG)0x0) {
      return 0xa9;
    }
    (*p_Var9)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
              ,"prepare_message_diagnostic_data",0x71,1,"malloc for DiagnosticData failed");
    return 0xa9;
  }
  __ptr = (char *)malloc(9);
  if (__ptr == (char *)0x0) {
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 != (LOGGER_LOG)0x0) {
      (*p_Var9)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                ,"prepare_message_diagnostic_data",0x78,1,"malloc for diagId failed");
    }
    goto LAB_001225b6;
  }
  for (lVar14 = 0; (int)lVar14 != 4; lVar14 = lVar14 + 1) {
    iVar6 = rand();
    uVar2 = (long)iVar6 / 0x24;
    lVar3 = (long)iVar6 % 0x24;
    bVar11 = (byte)lVar3;
    lVar4 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % 0x24;
    bVar5 = (byte)lVar4;
    bVar10 = bVar11 + 0x57;
    if ((uint)lVar3 < 10) {
      bVar10 = bVar11 | 0x30;
    }
    __ptr[lVar14 * 2] = bVar10;
    bVar11 = bVar5 + 0x57;
    if ((uint)lVar4 < 10) {
      bVar11 = bVar5 | 0x30;
    }
    __ptr[lVar14 * 2 + 1] = bVar11;
  }
  __ptr[lVar14 * 2] = '\0';
  diagnosticData->diagnosticId = __ptr;
  __s = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)malloc(0x1e);
  if (__s == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 != (LOGGER_LOG)0x0) {
      (*p_Var9)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                ,"prepare_message_diagnostic_data",0x86,1,"malloc for timeBuffer failed");
    }
    free(__ptr);
    goto LAB_001225b6;
  }
  tVar8 = get_time((time_t *)0x0);
  if (tVar8 == -1) {
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 != (LOGGER_LOG)0x0) {
      pcVar13 = "Failed getting current time";
      iVar6 = 0x1d;
      goto LAB_00122565;
    }
  }
  else {
    iVar6 = sprintf((char *)__s,"%lu",tVar8);
    if (-1 < iVar6) {
      diagnosticData->diagnosticCreationTimeUtc = (char *)__s;
      IVar7 = IoTHubMessage_SetDiagnosticPropertyData(messageHandle,diagnosticData);
      iVar6 = 0xaf;
      if (IVar7 == IOTHUB_MESSAGE_OK) {
        iVar6 = 0;
      }
      free(diagnosticData->diagnosticCreationTimeUtc);
      free(diagnosticData->diagnosticId);
      free(diagnosticData);
      return iVar6;
    }
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 != (LOGGER_LOG)0x0) {
      pcVar13 = "Failed sprintf to timeBuffer with 8 bytes of time_t";
      iVar6 = 0x24;
LAB_00122565:
      (*p_Var9)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                ,"get_epoch_time",iVar6,1,pcVar13);
    }
  }
  p_Var9 = xlogging_get_log_function();
  if (p_Var9 != (LOGGER_LOG)0x0) {
    (*p_Var9)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
              ,"prepare_message_diagnostic_data",0x8d,1,"Failed getting current time");
  }
  free(__ptr);
  free(diagnosticData);
  diagnosticData = __s;
LAB_001225b6:
  free(diagnosticData);
  return 0xa9;
}

Assistant:

int IoTHubClient_Diagnostic_AddIfNecessary(IOTHUB_DIAGNOSTIC_SETTING_DATA* diagSetting, IOTHUB_MESSAGE_HANDLE messageHandle)
{
    int result;
    if (diagSetting == NULL || messageHandle == NULL)
    {
        result = MU_FAILURE;
    }
    else if (should_add_diagnostic_info(diagSetting))
    {

        IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* diagnosticData;
        if ((diagnosticData = prepare_message_diagnostic_data()) == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (IoTHubMessage_SetDiagnosticPropertyData(messageHandle, diagnosticData) != IOTHUB_MESSAGE_OK)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            free(diagnosticData->diagnosticCreationTimeUtc);
            free(diagnosticData->diagnosticId);
            free(diagnosticData);
            diagnosticData = NULL;
        }
    }
    else
    {
        result = 0;
    }

    return result;
}